

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprint.cpp
# Opt level: O0

InputSlot * QPrintUtils::paperBinToInputSlot(int windowsId,QString *name)

{
  QString *in_RDX;
  int in_ESI;
  InputSlot *in_RDI;
  int i;
  InputSlot *slot;
  InputSlot *this;
  int local_20;
  
  this = in_RDI;
  memset(in_RDI,0xaa,0x38);
  QPrint::InputSlot::InputSlot(this);
  QString::operator=(&this->name,in_RDX);
  local_20 = 0;
  while( true ) {
    if (inputSlotMap[local_20].id == CustomInputSlot) {
      QByteArray::operator=(&this->key,inputSlotMap[local_20].key);
      this->id = inputSlotMap[local_20].id;
      this->windowsId = in_ESI;
      return in_RDI;
    }
    if (inputSlotMap[local_20].windowsId == in_ESI) break;
    local_20 = local_20 + 1;
  }
  QByteArray::operator=(&this->key,inputSlotMap[local_20].key);
  this->id = inputSlotMap[local_20].id;
  this->windowsId = inputSlotMap[local_20].windowsId;
  return in_RDI;
}

Assistant:

QPrint::InputSlot paperBinToInputSlot(int windowsId, const QString &name)
{
    QPrint::InputSlot slot;
    slot.name = name;
    int i;
    for (i = 0; inputSlotMap[i].id != QPrint::CustomInputSlot; ++i) {
        if (inputSlotMap[i].windowsId == windowsId) {
            slot.key = inputSlotMap[i].key;
            slot.id = inputSlotMap[i].id;
            slot.windowsId = inputSlotMap[i].windowsId;
            return slot;
        }
    }
    slot.key = inputSlotMap[i].key;
    slot.id = inputSlotMap[i].id;
    slot.windowsId = windowsId;
    return slot;
}